

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

Box __thiscall lunasvg::Element::getGlobalBoundingBox(Element *this)

{
  Box BVar1;
  Matrix local_48;
  Box local_30;
  Element *local_20;
  Element *this_local;
  
  local_20 = this;
  local_30 = getBoundingBox(this);
  getGlobalMatrix(&local_48,this);
  BVar1 = Box::transformed(&local_30,&local_48);
  return BVar1;
}

Assistant:

Box Element::getGlobalBoundingBox() const
{
    return getBoundingBox().transformed(getGlobalMatrix());
}